

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbfgs.c
# Opt level: O0

void trn_lbfgs(mdl_t *mdl)

{
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  double *pdVar5;
  uint64_t uVar6;
  FILE *pFVar7;
  FILE *pFVar8;
  _Bool _Var9;
  int iVar10;
  double *pdVar11;
  long lVar12;
  undefined8 *puVar13;
  long lVar14;
  double *pdVar15;
  size_t sVar16;
  ulong uVar17;
  double dVar18;
  undefined8 uStack_260;
  double local_258;
  double local_250;
  double *local_248;
  double local_240 [5];
  double local_218;
  long local_210;
  uint local_204;
  double *local_200;
  double *local_1f8;
  bool local_1e9;
  double *local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  undefined1 *local_1c8;
  uint local_1c0;
  uint local_1bc;
  uint32_t m_4;
  uint32_t m_3;
  uint64_t f_6;
  FILE *file_1;
  double of;
  double dlt;
  double gn;
  double xn;
  double dStack_180;
  uint32_t kn;
  uint64_t f_5;
  double vp;
  double or;
  uint64_t f_4;
  uint32_t ls;
  _Bool err_1;
  double fi;
  double gd;
  double stp;
  double sc;
  uint64_t f_3;
  uint32_t j_1;
  uint32_t i_2;
  uint64_t f_2;
  double v;
  double y2;
  uint32_t j;
  uint32_t i_1;
  double beta;
  unsigned_long __vla_expr4;
  uint local_f0;
  uint local_ec;
  uint32_t bnd;
  uint32_t km;
  uint64_t f_1;
  double rho1;
  double dStack_d0;
  uint32_t k;
  double fx;
  uint32_t m_2;
  uint32_t m_1;
  uint64_t f;
  uint64_t i;
  uint64_t nftr;
  int histsz;
  int type;
  FILE *file;
  char *err;
  grd_t *grd;
  ulong uStack_80;
  uint32_t m;
  unsigned_long __vla_expr3;
  unsigned_long __vla_expr2;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  double *local_58;
  double *d;
  double *pg;
  double *gp;
  double *g;
  double *xp;
  double *x;
  uint uStack_20;
  _Bool l1;
  uint32_t M;
  uint32_t C;
  uint32_t K;
  uint64_t F;
  mdl_t *mdl_local;
  
  F = (uint64_t)mdl;
  _C = (double)mdl->nftr;
  M = mdl->opt->maxiter;
  uStack_20 = mdl->opt->objwin;
  x._4_4_ = (mdl->opt->lbfgs).histsz;
  x._3_1_ = mdl->opt->rho1 != 0.0;
  __vla_expr0 = (unsigned_long)&local_258;
  local_1e0 = (long)&local_258 - ((ulong)x._4_4_ * 8 + 0xf & 0xfffffffffffffff0);
  __vla_expr1 = (ulong)x._4_4_;
  local_1d8 = local_1e0 - ((ulong)x._4_4_ * 8 + 0xf & 0xfffffffffffffff0);
  __vla_expr2 = (ulong)x._4_4_;
  local_1d0 = local_1d8 - ((ulong)x._4_4_ * 8 + 0xf & 0xfffffffffffffff0);
  __vla_expr3 = (ulong)x._4_4_;
  puVar13 = (undefined8 *)(local_1d0 - ((ulong)uStack_20 * 8 + 0xf & 0xfffffffffffffff0));
  local_1c8 = (undefined1 *)puVar13;
  uStack_80 = (ulong)uStack_20;
  xp = mdl->theta;
  *(undefined8 *)((long)puVar13 + -8) = 0x10d1db;
  g = xvm_new(*(uint64_t *)((long)puVar13 + 8));
  *(undefined8 *)((long)puVar13 + -8) = 0x10d1e8;
  gp = xvm_new(*(uint64_t *)((long)puVar13 + 8));
  *(undefined8 *)((long)puVar13 + -8) = 0x10d1f5;
  pg = xvm_new(*(uint64_t *)((long)puVar13 + 8));
  *(undefined8 *)((long)puVar13 + -8) = 0x10d202;
  local_58 = xvm_new(*(uint64_t *)((long)puVar13 + 8));
  for (grd._4_4_ = 0; grd._4_4_ < x._4_4_; grd._4_4_ = grd._4_4_ + 1) {
    *(undefined8 *)((long)puVar13 + -8) = 0x10d21e;
    pdVar11 = xvm_new(*(uint64_t *)((long)puVar13 + 8));
    *(double **)(local_1e0 + (ulong)grd._4_4_ * 8) = pdVar11;
    *(undefined8 *)((long)puVar13 + -8) = 0x10d238;
    pdVar11 = xvm_new(*(uint64_t *)((long)puVar13 + 8));
    *(double **)(local_1d8 + (ulong)grd._4_4_ * 8) = pdVar11;
  }
  if ((x._3_1_ & 1) == 0) {
    local_1e8 = (double *)0x0;
  }
  else {
    *(undefined8 *)((long)puVar13 + -8) = 0x10d263;
    local_1e8 = xvm_new(*(uint64_t *)((long)puVar13 + 8));
  }
  d = local_1e8;
  *(undefined8 *)((long)puVar13 + -8) = 0x10d28f;
  err = (char *)grd_new(*(mdl_t **)((long)puVar13 + 0x18),*(double **)((long)puVar13 + 0x10));
  if (*(long *)(*(long *)F + 0x48) != 0) {
    file = (FILE *)anon_var_dwarf_3fbf;
    pcVar4 = *(char **)(*(long *)F + 0x48);
    *(undefined8 *)((long)puVar13 + -8) = 0x10d2cd;
    _histsz = fopen(pcVar4,"r");
    if (_histsz == (FILE *)0x0) {
      *(undefined8 *)((long)puVar13 + -8) = 0x10d2ec;
      fatal("failed to open input state file");
    }
    pFVar7 = _histsz;
    *(undefined8 *)((long)puVar13 + -8) = 0x10d316;
    iVar10 = __isoc99_fscanf(pFVar7,"#state#%d#%d#%lu\n",(long)&nftr + 4,&nftr,&i);
    pFVar8 = file;
    if (iVar10 != 3) {
      *(undefined8 *)((long)puVar13 + -8) = 0x10d330;
      fatal("0 %s",pFVar8);
    }
    if ((nftr._4_4_ != 0) || ((uint)nftr != x._4_4_)) {
      *(undefined8 *)((long)puVar13 + -8) = 0x10d352;
      fatal("state is not compatible");
    }
    for (f = 0; pFVar7 = _histsz, f < i; f = f + 1) {
      *(undefined8 *)((long)puVar13 + -8) = 0x10d38d;
      iVar10 = __isoc99_fscanf(pFVar7,"%lu",&m_2);
      pFVar8 = file;
      if (iVar10 != 1) {
        *(undefined8 *)((long)puVar13 + -8) = 0x10d3a7;
        fatal("1 %s",pFVar8);
      }
      pFVar7 = _histsz;
      pdVar15 = g + _m_2;
      pdVar11 = pg + _m_2;
      *(undefined8 *)((long)puVar13 + -8) = 0x10d3e0;
      iVar10 = __isoc99_fscanf(pFVar7,"%la %la",pdVar15,pdVar11);
      pFVar8 = file;
      if (iVar10 != 2) {
        *(undefined8 *)((long)puVar13 + -8) = 0x10d3fa;
        fatal("2 %s",pFVar8);
      }
      for (fx._4_4_ = 0; pFVar7 = _histsz, fx._4_4_ < x._4_4_; fx._4_4_ = fx._4_4_ + 1) {
        lVar14 = *(long *)(local_1e0 + (ulong)fx._4_4_ * 8);
        lVar12 = _m_2 * 8;
        *(undefined8 *)((long)puVar13 + -8) = 0x10d447;
        iVar10 = __isoc99_fscanf(pFVar7,"%la",lVar14 + lVar12);
        pFVar8 = file;
        if (iVar10 != 1) {
          *(undefined8 *)((long)puVar13 + -8) = 0x10d461;
          fatal("3 %s",pFVar8);
        }
        pFVar7 = _histsz;
        lVar14 = *(long *)(local_1d8 + (ulong)fx._4_4_ * 8);
        lVar12 = _m_2 * 8;
        *(undefined8 *)((long)puVar13 + -8) = 0x10d495;
        iVar10 = __isoc99_fscanf(pFVar7,"%la",lVar14 + lVar12);
        pFVar8 = file;
        if (iVar10 != 1) {
          *(undefined8 *)((long)puVar13 + -8) = 0x10d4af;
          fatal("4 %s",pFVar8);
        }
      }
    }
    for (fx._0_4_ = 0; pFVar7 = _histsz, fx._0_4_ < x._4_4_; fx._0_4_ = fx._0_4_ + 1) {
      *(undefined8 *)((long)puVar13 + -8) = 0x10d51e;
      dVar18 = xvm_dot(*(double **)((long)puVar13 + 0x20),*(double **)((long)puVar13 + 0x18),
                       *(uint64_t *)((long)puVar13 + 0x10));
      *(double *)(local_1d0 + (ulong)fx._0_4_ * 8) = 1.0 / dVar18;
    }
    *(undefined8 *)((long)puVar13 + -8) = 0x10d55c;
    fclose(pFVar7);
  }
  *(undefined8 *)((long)puVar13 + -8) = 0x10d568;
  dStack_d0 = grd_gradient(*(grd_t **)((long)puVar13 + 0x70));
  rho1._4_4_ = 0;
  do {
    dVar18 = _C;
    pdVar11 = local_58;
    local_1e9 = false;
    if ((uit_stop & 1U) == 0) {
      local_1e9 = rho1._4_4_ < M;
    }
    if (local_1e9 == false) goto LAB_0010e14c;
    if ((x._3_1_ & 1) != 0) {
      f_1 = *(uint64_t *)(*(long *)F + 0x68);
      for (_bnd = 0.0; (ulong)_bnd < (ulong)_C; _bnd = (double)((long)_bnd + 1)) {
        if (0.0 < xp[(long)_bnd] || xp[(long)_bnd] == 0.0) {
          if (xp[(long)_bnd] <= 0.0) {
            if (-(double)f_1 <= gp[(long)_bnd]) {
              if (gp[(long)_bnd] <= (double)f_1) {
                d[(long)_bnd] = 0.0;
              }
              else {
                d[(long)_bnd] = gp[(long)_bnd] - (double)f_1;
              }
            }
            else {
              d[(long)_bnd] = gp[(long)_bnd] + (double)f_1;
            }
          }
          else {
            d[(long)_bnd] = gp[(long)_bnd] + (double)f_1;
          }
        }
        else {
          d[(long)_bnd] = gp[(long)_bnd] - (double)f_1;
        }
      }
    }
    local_1f8 = local_58;
    if ((x._3_1_ & 1) == 0) {
      local_200 = gp;
    }
    else {
      local_200 = d;
    }
    pdVar15 = local_200;
    *(undefined8 *)((long)puVar13 + -8) = 0x10d788;
    xvm_neg(pdVar11,pdVar15,(uint64_t)dVar18);
    if (rho1._4_4_ != 0) {
      local_ec = rho1._4_4_ % x._4_4_;
      if (x._4_4_ < rho1._4_4_) {
        local_204 = x._4_4_;
      }
      else {
        local_204 = rho1._4_4_;
      }
      local_f0 = local_204;
      __vla_expr4 = (unsigned_long)puVar13;
      lVar14 = (long)puVar13 - ((ulong)x._4_4_ * 8 + 0xf & 0xfffffffffffffff0);
      local_210 = lVar14;
      beta = (double)(ulong)x._4_4_;
      for (y2._4_4_ = local_204; y2._4_4_ != 0; y2._4_4_ = y2._4_4_ - 1) {
        y2._0_4_ = ((x._4_4_ + 1 + rho1._4_4_) - y2._4_4_) % x._4_4_;
        local_218 = *(double *)(local_1d0 + (ulong)y2._0_4_ * 8);
        *(undefined8 *)(lVar14 + -8) = 0x10d872;
        dVar18 = xvm_dot(*(double **)(lVar14 + 0x20),*(double **)(lVar14 + 0x18),
                         *(uint64_t *)(lVar14 + 0x10));
        *(double *)(local_210 + (ulong)(y2._4_4_ - 1) * 8) = local_218 * dVar18;
        *(undefined8 *)(lVar14 + -8) = 0x10d8e1;
        xvm_axpy(*(double **)(lVar14 + 0x40),*(double *)(lVar14 + 0x38),*(double **)(lVar14 + 0x30),
                 *(double **)(lVar14 + 0x28),*(uint64_t *)(lVar14 + 0x20));
      }
      *(undefined8 *)(lVar14 + -8) = 0x10d919;
      v = xvm_dot(*(double **)(lVar14 + 0x20),*(double **)(lVar14 + 0x18),
                  *(uint64_t *)(lVar14 + 0x10));
      f_2 = (uint64_t)(1.0 / (*(double *)(local_1d0 + (ulong)local_ec * 8) * v));
      for (_j_1 = 0.0; (ulong)_j_1 < (ulong)_C; _j_1 = (double)((long)_j_1 + 1)) {
        local_58[(long)_j_1] = (double)f_2 * local_58[(long)_j_1];
      }
      for (f_3._4_4_ = 0; puVar13 = (undefined8 *)__vla_expr4, f_3._4_4_ < local_f0;
          f_3._4_4_ = f_3._4_4_ + 1) {
        f_3._0_4_ = ((x._4_4_ + rho1._4_4_) - f_3._4_4_) % x._4_4_;
        local_240[4] = *(double *)(local_1d0 + (ulong)(uint)f_3 * 8);
        *(undefined8 *)(lVar14 + -8) = 0x10da06;
        dVar18 = xvm_dot(*(double **)(lVar14 + 0x20),*(double **)(lVar14 + 0x18),
                         *(uint64_t *)(lVar14 + 0x10));
        _j = local_240[4] * dVar18;
        *(undefined8 *)(lVar14 + -8) = 0x10da59;
        xvm_axpy(*(double **)(lVar14 + 0x40),*(double *)(lVar14 + 0x38),*(double **)(lVar14 + 0x30),
                 *(double **)(lVar14 + 0x28),*(uint64_t *)(lVar14 + 0x20));
      }
    }
    pdVar15 = xp;
    pdVar11 = g;
    if ((x._3_1_ & 1) != 0) {
      for (sc = 0.0; (ulong)sc < (ulong)_C; sc = (double)((long)sc + 1)) {
        if (0.0 <= local_58[(long)sc] * d[(long)sc]) {
          local_58[(long)sc] = 0.0;
        }
      }
    }
    sVar16 = (long)_C << 3;
    *(undefined8 *)((long)puVar13 + -8) = 0x10dafe;
    memcpy(pdVar11,pdVar15,sVar16);
    pdVar15 = gp;
    pdVar11 = pg;
    sVar16 = (long)_C << 3;
    *(undefined8 *)((long)puVar13 + -8) = 0x10db13;
    memcpy(pdVar11,pdVar15,sVar16);
    local_240[2] = 0.5;
    local_240[3] = 0.1;
    if (rho1._4_4_ != 0) {
      local_240[3] = 0.5;
    }
    stp = local_240[3];
    if (rho1._4_4_ == 0) {
      *(undefined8 *)((long)puVar13 + -8) = 0x10db74;
      dVar18 = xvm_norm(*(double **)((long)puVar13 + 0x80),*(uint64_t *)((long)puVar13 + 0x78));
      local_240[1] = 1.0 / dVar18;
    }
    else {
      local_240[1] = 1.0;
    }
    gd = local_240[1];
    if ((x._3_1_ & 1) == 0) {
      *(undefined8 *)((long)puVar13 + -8) = 0x10dbd3;
      local_240[0] = xvm_dot(*(double **)((long)puVar13 + 0x20),*(double **)((long)puVar13 + 0x18),
                             *(uint64_t *)((long)puVar13 + 0x10));
    }
    else {
      local_240[0] = 0.0;
    }
    fi = local_240[0];
    _ls = dStack_d0;
    f_4._7_1_ = 0;
    f_4._0_4_ = 1;
    while (((uit_stop ^ 0xffU) & 1) != 0) {
      *(undefined8 *)((long)puVar13 + -8) = 0x10dc3d;
      xvm_axpy(*(double **)((long)puVar13 + 0x40),*(double *)((long)puVar13 + 0x38),
               *(double **)((long)puVar13 + 0x30),*(double **)((long)puVar13 + 0x28),
               *(uint64_t *)((long)puVar13 + 0x20));
      if ((x._3_1_ & 1) != 0) {
        for (or = 0.0; (ulong)or < (ulong)_C; or = (double)((long)or + 1)) {
          vp = g[(long)or];
          if ((vp == 0.0) && (!NAN(vp))) {
            vp = -d[(long)or];
          }
          if (xp[(long)or] * vp <= 0.0) {
            xp[(long)or] = 0.0;
          }
        }
      }
      *(undefined8 *)((long)puVar13 + -8) = 0x10dd18;
      dStack_d0 = grd_gradient(*(grd_t **)((long)puVar13 + 0x70));
      if ((x._3_1_ & 1) == 0) {
        if (dStack_d0 <= gd * fi * 0.0001 + _ls) {
          *(undefined8 *)((long)puVar13 + -8) = 0x10dd83;
          dVar18 = xvm_dot(*(double **)((long)puVar13 + 0x20),*(double **)((long)puVar13 + 0x18),
                           *(uint64_t *)((long)puVar13 + 0x10));
          if (fi * 0.9 <= dVar18) break;
          stp = 2.1;
        }
        else {
          stp = 0.5;
        }
      }
      else {
        f_5 = 0;
        for (dStack_180 = 0.0; (ulong)dStack_180 < (ulong)_C;
            dStack_180 = (double)((long)dStack_180 + 1)) {
          f_5 = (uint64_t)
                ((xp[(long)dStack_180] - g[(long)dStack_180]) * local_58[(long)dStack_180] +
                (double)f_5);
        }
        if (dStack_d0 < (double)f_5 * 0.0001 + _ls) break;
      }
      if ((int)f_4 == *(int *)(*(long *)F + 0x90)) {
        *(undefined8 *)((long)puVar13 + -8) = 0x10de8e;
        warning("maximum linesearch reached");
        f_4._7_1_ = 1;
        break;
      }
      f_4._0_4_ = (int)f_4 + 1;
      gd = stp * gd;
    }
    pdVar15 = xp;
    pdVar11 = g;
    if (((f_4._7_1_ & 1) != 0) || ((uit_stop & 1U) != 0)) {
      sVar16 = (long)_C << 3;
      *(undefined8 *)((long)puVar13 + -8) = 0x10deef;
      memcpy(pdVar15,pdVar11,sVar16);
LAB_0010e14c:
      if (*(long *)(*(long *)F + 0x50) != 0) {
        pcVar4 = *(char **)(*(long *)F + 0x50);
        puVar13[-1] = 0x10e175;
        f_6 = (uint64_t)fopen(pcVar4,"w");
        if ((FILE *)f_6 == (FILE *)0x0) {
          puVar13[-1] = 0x10e194;
          fatal("failed to open output state file");
        }
        dVar18 = _C;
        uVar6 = f_6;
        uVar17 = (ulong)x._4_4_;
        puVar13[-1] = 0x10e1b0;
        fprintf((FILE *)uVar6,"#state#0#%u#%lu\n",uVar17,dVar18);
        for (_m_4 = 0.0; uVar6 = f_6, dVar18 = _m_4, (ulong)_m_4 < (ulong)_C;
            _m_4 = (double)((long)_m_4 + 1)) {
          puVar13[-1] = 0x10e1e8;
          fprintf((FILE *)uVar6,"%lu",dVar18);
          uVar6 = f_6;
          dVar18 = g[(long)_m_4];
          dVar1 = pg[(long)_m_4];
          puVar13[-1] = 0x10e21d;
          fprintf((FILE *)uVar6," %la %la",dVar18,SUB84(dVar1,0));
          for (local_1bc = 0; uVar6 = f_6, local_1bc < x._4_4_; local_1bc = local_1bc + 1) {
            uVar2 = *(undefined8 *)(*(long *)(local_1e0 + (ulong)local_1bc * 8) + (long)_m_4 * 8);
            uVar3 = *(undefined8 *)(*(long *)(local_1d8 + (ulong)local_1bc * 8) + (long)_m_4 * 8);
            puVar13[-1] = 0x10e281;
            fprintf((FILE *)uVar6," %la %la",uVar2,(int)uVar3);
          }
          puVar13[-1] = 0x10e2a7;
          fprintf((FILE *)uVar6,"\n");
        }
        puVar13[-1] = 0x10e2ca;
        fclose((FILE *)uVar6);
      }
      puVar13[-1] = 0x10e2d3;
      xvm_free((double *)*puVar13);
      puVar13[-1] = 0x10e2dc;
      xvm_free((double *)*puVar13);
      puVar13[-1] = 0x10e2e5;
      xvm_free((double *)*puVar13);
      puVar13[-1] = 0x10e2ee;
      xvm_free((double *)*puVar13);
      for (local_1c0 = 0; local_1c0 < x._4_4_; local_1c0 = local_1c0 + 1) {
        puVar13[-1] = 0x10e319;
        xvm_free((double *)*puVar13);
        puVar13[-1] = 0x10e32f;
        xvm_free((double *)*puVar13);
      }
      if ((x._3_1_ & 1) != 0) {
        puVar13[-1] = 0x10e34f;
        xvm_free((double *)*puVar13);
      }
      puVar13[-1] = 0x10e35b;
      grd_free((grd_t *)puVar13[1]);
      return;
    }
    *(undefined8 *)((long)puVar13 + -8) = 0x10df0e;
    _Var9 = uit_progress(*(mdl_t **)((long)puVar13 + 0x70),*(uint32_t *)((long)puVar13 + 0x6c),
                         *(double *)((long)puVar13 + 0x60));
    dVar18 = _C;
    pdVar15 = xp;
    pdVar11 = g;
    if (!_Var9) goto LAB_0010e14c;
    xn._4_4_ = (rho1._4_4_ + 1) % x._4_4_;
    pdVar5 = *(double **)(local_1e0 + (ulong)xn._4_4_ * 8);
    *(undefined8 *)((long)puVar13 + -8) = 0x10df53;
    xvm_sub(pdVar5,pdVar15,pdVar11,(uint64_t)dVar18);
    dVar18 = _C;
    pdVar5 = gp;
    pdVar15 = pg;
    pdVar11 = *(double **)(local_1d8 + (ulong)xn._4_4_ * 8);
    *(undefined8 *)((long)puVar13 + -8) = 0x10df75;
    xvm_sub(pdVar11,pdVar5,pdVar15,(uint64_t)dVar18);
    *(undefined8 *)((long)puVar13 + -8) = 0x10dfa0;
    dVar18 = xvm_dot(*(double **)((long)puVar13 + 0x20),*(double **)((long)puVar13 + 0x18),
                     *(uint64_t *)((long)puVar13 + 0x10));
    *(double *)(local_1d0 + (ulong)xn._4_4_ * 8) = 1.0 / dVar18;
    *(undefined8 *)((long)puVar13 + -8) = 0x10dfce;
    gn = xvm_norm(*(double **)((long)puVar13 + 0x80),*(uint64_t *)((long)puVar13 + 0x78));
    if ((x._3_1_ & 1) == 0) {
      local_248 = gp;
    }
    else {
      local_248 = d;
    }
    *(undefined8 *)((long)puVar13 + -8) = 0x10e004;
    dlt = xvm_norm(*(double **)((long)puVar13 + 0x80),*(uint64_t *)((long)puVar13 + 0x78));
    local_250 = dlt;
    if (1.0 <= gn) {
      local_258 = gn;
    }
    else {
      local_258 = 1.0;
    }
    if ((dlt / local_258 <= 1e-05) || (rho1._4_4_ + 1 == M)) goto LAB_0010e14c;
    *(double *)(local_1c8 + ((ulong)rho1._4_4_ % (ulong)uStack_20) * 8) = dStack_d0;
    of = 1.0;
    if (uStack_20 <= rho1._4_4_) {
      file_1 = *(FILE **)(local_1c8 + ((ulong)(rho1._4_4_ + 1) % (ulong)uStack_20) * 8);
      of = ABS((double)file_1 - dStack_d0) / (double)file_1;
      if (of < *(double *)(*(long *)F + 0x80)) goto LAB_0010e14c;
    }
    rho1._4_4_ = rho1._4_4_ + 1;
  } while( true );
}

Assistant:

void trn_lbfgs(mdl_t *mdl) {
	const uint64_t F  = mdl->nftr;
	const uint32_t K  = mdl->opt->maxiter;
	const uint32_t C  = mdl->opt->objwin;
	const uint32_t M  = mdl->opt->lbfgs.histsz;
	const bool     l1 = mdl->opt->rho1 != 0.0;
	double *x, *xp; // Current and previous value of the variables
	double *g, *gp; // Current and previous value of the gradient
	double *pg;     // The pseudo-gradient (only for owl-qn)
	double *d;      // The search direction
	double *s[M];   // History value s_k = Δ(x,px)
	double *y[M];   // History value y_k = Δ(g,pg)
	double  p[M];   // ρ_k
	double  fh[C];  // f(x) history
	// Initialization: Here, we have to allocate memory on the heap as we
	// cannot request so much memory on the stack as this will have a too
	// big impact on performance and will be refused by the system on non-
	// trivial models.
	x  = mdl->theta;
	xp = xvm_new(F); g = xvm_new(F);
	gp = xvm_new(F); d = xvm_new(F);
	for (uint32_t m = 0; m < M; m++) {
		s[m] = xvm_new(F);
		y[m] = xvm_new(F);
	}
	pg = l1 ? xvm_new(F) : NULL;
	grd_t *grd = grd_new(mdl, g);
	// Restore a saved state if user specified one.
	if (mdl->opt->rstate != NULL) {
		const char *err = "invalid state file";
		FILE *file = fopen(mdl->opt->rstate, "r");
		if (file == NULL)
			fatal("failed to open input state file");
		int type, histsz;
		uint64_t nftr;
		if (fscanf(file, "#state#%d#%d#%"SCNu64"\n", &type, &histsz,
				&nftr) != 3)
			fatal("0 %s", err);
		if (type != 0 || histsz != (int)M)
			fatal("state is not compatible");
		for (uint64_t i = 0; i < nftr; i++) {
			uint64_t f;
			if (fscanf(file, "%"PRIu64, &f) != 1)
				fatal("1 %s", err);
			if (fscanf(file, "%la %la", &xp[f], &gp[f]) != 2)
				fatal("2 %s", err);
			for (uint32_t m = 0; m < M; m++) {
				if (fscanf(file, "%la", &s[m][f]) != 1)
					fatal("3 %s", err);
				if (fscanf(file, "%la", &y[m][f]) != 1)
					fatal("4 %s", err);
			}
		}
		for (uint32_t m = 0; m < M; m++)
			p[m] = 1.0 / xvm_dot(y[m], s[m], F);
		fclose(file);
	}
	// Minimization: This is the heart of the function. (a big heart...) We
	// will perform iterations until one these conditions is reached
	//   - the maximum iteration count is reached
	//   - we have converged (upto numerical precision)
	//   - the report function return false
	//   - an error happen somewhere
	double fx = grd_gradient(grd);
	for (uint32_t k = 0; !uit_stop && k < K; k++) {
		// We first compute the pseudo-gradient of f for owl-qn. It is
		// defined in [3, pp 335(4)]
		//              | ∂_i^- f(x)   if ∂_i^- f(x) > 0
		//   ◇_i f(x) = | ∂_i^+ f(x)   if ∂_i^+ f(x) < 0
		//              | 0            otherwise
		// with
		//   ∂_i^± f(x) = ∂/∂x_i l(x) + | Cσ(x_i) if x_i ≠ 0
		//                              | ±C      if x_i = 0
		if (l1) {
			const double rho1 = mdl->opt->rho1;
			for (uint64_t f = 0; f < F; f++) {
				if (x[f] < 0.0)
					pg[f] = g[f] - rho1;
				else if (x[f] > 0.0)
					pg[f] = g[f] + rho1;
				else if (g[f] < -rho1)
					pg[f] = g[f] + rho1;
				else if (g[f] > rho1)
					pg[f] = g[f] - rho1;
				else
					pg[f] = 0.0;
			}
		}
		// 1st step: We compute the search direction. We search in the
		// direction who minimize the second order approximation given
		// by the Taylor series which give
		//   d_k = - H_k^{-1} g_k
		// But computing the inverse of the hessian is intractable so
		// the l-bfgs only approximate it's diagonal. The exact
		// computation is well described in [1, pp 779].
		// The only special thing for owl-qn here is to use the pseudo
		// gradient instead of the true one.
		xvm_neg(d, l1 ? pg : g, F);
		if (k != 0) {
			const uint32_t km = k % M;
			const uint32_t bnd = (k <= M) ? k : M;
			double alpha[M], beta;
			// α_i = ρ_j s_j^T q_{i+1}
			// q_i = q_{i+1} - α_i y_i
			for (uint32_t i = bnd; i > 0; i--) {
				const uint32_t j = (M + 1 + k - i) % M;
				alpha[i - 1] = p[j] * xvm_dot(s[j], d, F);
				xvm_axpy(d, -alpha[i - 1], y[j], d, F);
			}
			// r_0 = H_0 q_0
			//     Scaling is described in [2, pp 515]
			//     for k = 0: H_0 = I
			//     for k > 0: H_0 = I * y_k^T s_k / ||y_k||²
			//                    = I * 1 / ρ_k ||y_k||²
			const double y2 = xvm_dot(y[km], y[km], F);
			const double v = 1.0 / (p[km] * y2);
			for (uint64_t f = 0; f < F; f++)
				d[f] *= v;
			// β_j     = ρ_j y_j^T r_i
			// r_{i+1} = r_i + s_j (α_i - β_i)
			for (uint32_t i = 0; i < bnd; i++) {
				const uint32_t j = (M + k - i) % M;
				beta = p[j] * xvm_dot(y[j], d, F);
				xvm_axpy(d, alpha[i] - beta, s[j], d, F);
			}
		}
		// For owl-qn, we must remain in the same orthant than the
		// pseudo-gradient, so we have to constrain the search
		// direction as described in [3, pp 35(3)]
		//   d^k = π(d^k ; v^k)
		//       = π(d^k ; -◇f(x^k))
		if (l1)
			for (uint64_t f = 0; f < F; f++)
				if (d[f] * pg[f] >= 0.0)
					d[f] = 0.0;
		// 2nd step: we perform a linesearch in the computed direction,
		// we search a step value that satisfy the constrains using a
		// backtracking algorithm. Much elaborated algorithm can perform
		// better in the general case, but for CRF training, bactracking
		// is very efficient and simple to implement.
		// For quasi-Newton, the natural step is 1.0 so we start with
		// this one and reduce it only if it fail with an exception for
		// the first step where a better guess can be done.
		// We have to keep track of the current point and gradient as we
		// will need to compute the delta between those and the found
		// point, and perhaps need to restore them if linesearch fail.
		memcpy(xp, x, sizeof(double) * F);
		memcpy(gp, g, sizeof(double) * F);
		double sc  = (k == 0) ? 0.1 : 0.5;
		double stp = (k == 0) ? 1.0 / xvm_norm(d, F) : 1.0;
		double gd  = l1 ? 0.0 : xvm_dot(g, d, F); // gd = g_k^T d_k
		double fi  = fx;
		bool err = false;
		for (uint32_t ls = 1; !uit_stop; ls++, stp *= sc) {
			// We compute the new point using the current step and
			// search direction
			xvm_axpy(x, stp, d, xp, F);
			// For owl-qn, we have to project back the point in the
			// current orthant [3, pp 35]
			//   x^{k+1} = π(x^k + αp^k ; ξ)
			if (l1) {
				for (uint64_t f = 0; f < F; f++) {
					double or = xp[f];
					if (or == 0.0)
						or = -pg[f];
					if (x[f] * or <= 0.0)
						x[f] = 0.0;
				}
			}
			// And we ask for the value of the objective function
			// and its gradient.
			fx = grd_gradient(grd);
			// Now we check if the step satisfy the conditions. For
			// l-bfgs, we check the classical decrease and curvature
			// known as the Wolfe conditions [2, pp 506]
			//   f(x_k + α_k d_k) ≤ f(x_k) + β' α_k g_k^T d_k
			//   g(x_k + α_k d_k)^T d_k ≥ β g_k^T d_k
			//
			// And for owl-qn we check a variant of the Armijo rule
			// described in [3, pp 36]
			//   f(π(x^k+αp^k;ξ)) ≤ f(x^k) - γv^T[π(x^k+αp^k;ξ)-x^k]
			if (!l1) {
				if (fx > fi + stp * gd * 1e-4)
					sc = 0.5;
				else if (xvm_dot(g, d, F) < gd * 0.9)
					sc = 2.1;
				else
					break;
			} else {
				double vp = 0.0;
				for (uint64_t f = 0; f < F; f++)
					vp += (x[f] - xp[f]) * d[f];
				if (fx < fi + vp * 1e-4)
					break;
			}
			// If we reach the maximum number of linesearsh steps
			// without finding a good one, we just fail.
			if (ls == mdl->opt->lbfgs.maxls) {
				warning("maximum linesearch reached");
				err = true;
				break;
			}
		}
		// If linesearch failed or user interupted training, we return
		// to the last valid point and stop the training. The model is
		// probably not fully optimized but we let the user decide what
		// to do with it.
		if (err || uit_stop) {
			memcpy(x, xp, sizeof(double) * F);
			break;
		}
		if (uit_progress(mdl, k + 1, fx) == false)
			break;
		// 3rd step: we update the history used for approximating the
		// inverse of the diagonal of the hessian
		//   s_k = x_{k+1} - x_k
		//   y_k = g_{k+1} - g_k
		//   ρ_k = 1 / y_k^T s_k
		const uint32_t kn = (k + 1) % M;
		xvm_sub(s[kn], x, xp, F);
		xvm_sub(y[kn], g, gp, F);
		p[kn] = 1.0 / xvm_dot(y[kn], s[kn], F);
		// And last, we check for convergence. The convergence check is
		// quite simple [2, pp 508]
		//   ||g|| / max(1, ||x||) ≤ ε
		// with ε small enough so we stop when numerical precision is
		// reached. For owl-qn we just have to check against the pseudo-
		// gradient instead of the true one.
		const double xn = xvm_norm(x, F);
		const double gn = xvm_norm(l1 ? pg : g, F);
		if (gn / max(xn, 1.0) <= 1e-5)
			break;
		if (k + 1 == K)
			break;
		// Second stoping criterion tested is a check for improvement of
		// the function value over the past W iteration. When this come
		// under an epsilon, we also stop the minimization.
		fh[k % C] = fx;
		double dlt = 1.0;
		if (k >= C) {
			const double of = fh[(k + 1) % C];
			dlt = fabs(of - fx) / of;
			if (dlt < mdl->opt->stopeps)
				break;
		}
	}
	// Save the optimizer state if requested by the user
	if (mdl->opt->sstate != NULL) {
		FILE *file = fopen(mdl->opt->sstate, "w");
		if (file == NULL)
			fatal("failed to open output state file");
		fprintf(file, "#state#0#%"PRIu32"#%"PRIu64"\n", M, F);
		for (uint64_t f = 0; f < F; f++) {
			fprintf(file, "%"PRIu64, f);
			fprintf(file, " %la %la", xp[f], gp[f]);
			for (uint32_t m = 0; m < M; m++)
				fprintf(file, " %la %la", s[m][f], y[m][f]);
			fprintf(file, "\n");
		}
		fclose(file);
	}
	// Cleanup: We free all the vectors we have allocated.
	xvm_free(xp); xvm_free(g);
	xvm_free(gp); xvm_free(d);
	for (uint32_t m = 0; m < M; m++) {
		xvm_free(s[m]);
		xvm_free(y[m]);
	}
	if (l1)
		xvm_free(pg);
	grd_free(grd);
}